

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absRpm.c
# Opt level: O1

int Abs_GiaCofPrint(word *pTruth,int nSize,int nSize0,int Res)

{
  uint uVar1;
  uint uVar2;
  int Mark [2];
  int local_38 [2];
  
  local_38[0] = 1;
  local_38[1] = 1;
  if (nSize != 0x1f) {
    uVar1 = 1 << ((byte)nSize & 0x1f);
    if ((int)uVar1 < 2) {
      uVar1 = 1;
    }
    uVar2 = 0;
    do {
      if ((uVar2 & ~(-1 << ((byte)nSize0 & 0x1f))) == 0) {
        putchar(0x20);
        if ((Res == 0) && ((local_38[0] == 0 || (local_38[1] == 0)))) {
          __assert_fail("Res || (Mark[0] && Mark[1])",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absRpm.c"
                        ,0x25d,"int Abs_GiaCofPrint(word *, int, int, int)");
        }
        local_38[0] = 0;
        local_38[1] = 0;
      }
      local_38[(*(uint *)((long)pTruth + (ulong)(uVar2 >> 5) * 4) >> (uVar2 & 0x1f) & 1) != 0] = 1;
      printf("%d");
      uVar2 = uVar2 + 1;
    } while (uVar1 != uVar2);
  }
  putchar(10);
  if ((Res == 0) && ((local_38[0] == 0 || (local_38[1] == 0)))) {
    __assert_fail("Res || (Mark[0] && Mark[1])",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absRpm.c"
                  ,0x265,"int Abs_GiaCofPrint(word *, int, int, int)");
  }
  return 1;
}

Assistant:

int Abs_GiaCofPrint( word * pTruth, int nSize, int nSize0, int Res )
{
    int i, Bit;
    int nBits = (1 << nSize);
    int nStep = (1 << nSize0);
    int Mark[2] = {1,1};
    for ( i = 0; i < nBits; i++ )
    {
        if ( i % nStep == 0 )
        {
            printf( " " );
            assert( Res || (Mark[0] && Mark[1]) );
            Mark[0] = Mark[1] = 0;
        }
        Bit = Abc_InfoHasBit((unsigned *)pTruth, i);
        Mark[Bit] = 1;
        printf( "%d", Bit );
    }
    printf( "\n" );
    assert( Res || (Mark[0] && Mark[1]) );
    return 1;
}